

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR skip_section(lyxml_ctx *xmlctx,char *delim,size_t delim_len,char *sectname)

{
  char cVar1;
  ly_in *in;
  long lVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  
  in = xmlctx->in;
  pcVar3 = in->current;
  lVar2 = 0;
  lVar4 = 0;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"%s not terminated.",sectname);
      return LY_EVALID;
    }
    if (cVar1 == *delim) {
      sVar5 = 0;
      while( true ) {
        if (delim_len == sVar5) goto LAB_00197866;
        if (pcVar3[sVar5] != delim[sVar5]) break;
        sVar5 = sVar5 + 1;
      }
      if (delim_len == sVar5) {
LAB_00197866:
        in->line = in->line + lVar4;
        ly_in_skip(in,lVar2 + delim_len);
        return LY_SUCCESS;
      }
    }
    else {
      lVar4 = lVar4 + (ulong)(cVar1 == '\n');
    }
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

LY_ERR
skip_section(struct lyxml_ctx *xmlctx, const char *delim, size_t delim_len, const char *sectname)
{
    size_t i;
    register const char *input, *a, *b;
    uint64_t parsed = 0, newlines = 0;

    for (input = xmlctx->in->current; *input; ++input, ++parsed) {
        if (*input != *delim) {
            if (*input == '\n') {
                ++newlines;
            }
            continue;
        }
        a = input;
        b = delim;
        for (i = 0; i < delim_len; ++i) {
            if (*a++ != *b++) {
                break;
            }
        }
        if (i == delim_len) {
            /* delim found */
            xmlctx->in->line += newlines;
            ly_in_skip(xmlctx->in, parsed + delim_len);
            return LY_SUCCESS;
        }
    }

    /* delim not found,
     * do not update input handler to refer to the beginning of the section in error message */
    LOGVAL(xmlctx->ctx, LY_VCODE_NTERM, sectname);
    return LY_EVALID;
}